

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_try(CTcParser *this,int *err)

{
  CTcPrsSymtab *pCVar1;
  CTcPrsSymtab *pCVar2;
  textchar_t *sym;
  size_t len;
  CTPNStmCatch *pCVar3;
  CTPNStmEnclosing *pCVar4;
  long lVar5;
  tc_toktyp_t tVar6;
  int iVar7;
  int iVar8;
  CTPNStm *pCVar9;
  CTPNStmCatch *this_00;
  CTcSymLocal *pCVar10;
  CTPNStmEnclosing *pCVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTPNStmCatch **ppCVar12;
  int *siz;
  CTcTokenizer *pCVar13;
  bool bVar14;
  CTPNStmTry *local_58;
  
  local_58 = (CTPNStmTry *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x50,(size_t)err);
  CTPNStmTry::CTPNStmTry(local_58,this->enclosing_stm_);
  pCVar11 = this->enclosing_stm_;
  this->enclosing_stm_ = (CTPNStmEnclosing *)local_58;
  CTcTokenizer::next(G_tok);
  siz = err;
  pCVar9 = parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
  this->enclosing_stm_ = pCVar11;
  if (*err != 0) {
    return (CTPNStm *)(CTPNStmTry *)0x0;
  }
  (local_58->super_CTPNStmTryBase).body_stm_ = pCVar9;
  while (tVar6 = (G_tok->curtok_).typ_, tVar6 == TOKT_CATCH) {
    pCVar1 = this->local_symtab_;
    pCVar2 = this->enclosing_local_symtab_;
    this->enclosing_local_symtab_ = pCVar1;
    create_scope_local_symtab(this);
    this_00 = (CTPNStmCatch *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x50,(size_t)siz);
    CTPNStmCatch::CTPNStmCatch(this_00);
    pCVar13 = G_tok;
    lVar5 = G_tok->last_linenum_;
    (this_00->super_CTPNStmCatchBase).super_CTPNStm.super_CTPNStmBase.file_ = G_tok->last_desc_;
    (this_00->super_CTPNStmCatchBase).super_CTPNStm.super_CTPNStmBase.linenum_ = lVar5;
    tVar6 = CTcTokenizer::next(pCVar13);
    if (tVar6 == TOKT_LPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b50);
    }
    pCVar13 = G_tok;
    tVar6 = (G_tok->curtok_).typ_;
    bVar14 = tVar6 == TOKT_SYM;
    if (bVar14) {
      (this_00->super_CTPNStmCatchBase).exc_class_ = (G_tok->curtok_).text_;
      (this_00->super_CTPNStmCatchBase).exc_class_len_ = (pCVar13->curtok_).text_len_;
LAB_00235228:
      CTcTokenizer::next(pCVar13);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b52);
      pCVar13 = G_tok;
      if ((G_tok->curtok_).typ_ != TOKT_RPAR) goto LAB_00235228;
    }
    if ((G_tok->curtok_).typ_ == TOKT_SYM) {
      sym = (G_tok->curtok_).text_;
      len = (G_tok->curtok_).text_len_;
      iVar7 = this->local_cnt_;
      if (this->max_local_cnt_ <= iVar7) {
        this->max_local_cnt_ = iVar7 + 1;
      }
      this->local_cnt_ = iVar7 + 1;
      pCVar10 = CTcPrsSymtab::add_local(this->local_symtab_,sym,len,iVar7,0,1,1);
      if (tVar6 == TOKT_SYM) {
        (this_00->super_CTPNStmCatchBase).exc_var_ = pCVar10;
      }
LAB_002352bd:
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b53);
      bVar14 = false;
      if ((G_tok->curtok_).typ_ != TOKT_RPAR) goto LAB_002352bd;
    }
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b51);
    }
    siz = err;
    pCVar9 = parse_stm(this,err,(CTPNStmSwitch *)0x0,1);
    this->local_symtab_ = pCVar1;
    this->enclosing_local_symtab_ = pCVar2;
    if (*err != 0) {
      return (CTPNStm *)(CTPNStmTry *)0x0;
    }
    if (bVar14) {
      (this_00->super_CTPNStmCatchBase).body_ = pCVar9;
      (this_00->super_CTPNStmCatchBase).symtab_ = this->local_symtab_;
      pCVar3 = (local_58->super_CTPNStmTryBase).last_catch_stm_;
      ppCVar12 = &(pCVar3->super_CTPNStmCatchBase).next_catch_;
      if (pCVar3 == (CTPNStmCatch *)0x0) {
        ppCVar12 = &(local_58->super_CTPNStmTryBase).first_catch_stm_;
      }
      *ppCVar12 = this_00;
      (local_58->super_CTPNStmTryBase).last_catch_stm_ = this_00;
      (this_00->super_CTPNStmCatchBase).next_catch_ = (CTPNStmCatch *)0x0;
      (this_00->super_CTPNStmCatchBase).super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)0x0;
    }
  }
  if (tVar6 != TOKT_FINALLY) {
    if ((local_58->super_CTPNStmTryBase).finally_stm_ != (CTPNStmFinally *)0x0 ||
        (local_58->super_CTPNStmTryBase).first_catch_stm_ != (CTPNStmCatch *)0x0) {
      return (CTPNStm *)local_58;
    }
    CTPNStmBase::log_error((CTPNStmBase *)local_58,0x2b4f);
    return (CTPNStm *)local_58;
  }
  pCVar1 = this->local_symtab_;
  pCVar2 = this->enclosing_local_symtab_;
  this->enclosing_local_symtab_ = pCVar1;
  pCVar11 = (CTPNStmEnclosing *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,(size_t)siz);
  iVar8 = this->local_cnt_;
  iVar7 = iVar8 + 1;
  if (iVar8 < this->max_local_cnt_) {
    this->local_cnt_ = iVar7;
    if (iVar7 < this->max_local_cnt_) goto LAB_002353ed;
  }
  else {
    this->max_local_cnt_ = iVar7;
    this->local_cnt_ = iVar7;
  }
  this->max_local_cnt_ = iVar8 + 2;
LAB_002353ed:
  this->local_cnt_ = iVar8 + 2;
  CTPNStmFinally::CTPNStmFinally((CTPNStmFinally *)pCVar11,this->enclosing_stm_,iVar8,iVar7);
  pCVar13 = G_tok;
  lVar5 = G_tok->last_linenum_;
  (((CTPNStmFinallyBase *)&pCVar11->super_CTPNStm)->super_CTPNStmEnclosing).super_CTPNStm.
  super_CTPNStmBase.file_ = G_tok->last_desc_;
  (((CTPNStmFinallyBase *)&pCVar11->super_CTPNStm)->super_CTPNStmEnclosing).super_CTPNStm.
  super_CTPNStmBase.linenum_ = lVar5;
  CTcTokenizer::next(pCVar13);
  pCVar4 = this->enclosing_stm_;
  this->enclosing_stm_ = pCVar11;
  pCVar9 = parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
  if (pCVar9 != (CTPNStm *)0x0) {
    iVar7 = (**(code **)(*(long *)&(pCVar9->super_CTPNStmBase).super_CTcPrsNode + 0xd0))(pCVar9);
    iVar8 = (**(code **)(*(long *)&(pCVar9->super_CTPNStmBase).super_CTcPrsNode + 0xd8))(pCVar9);
    pCVar11[1].super_CTPNStm.super_CTPNStmBase.file_ =
         (CTcTokFileDesc *)CONCAT44(extraout_var,iVar7);
    pCVar11[1].super_CTPNStm.super_CTPNStmBase.linenum_ = CONCAT44(extraout_var_00,iVar8);
  }
  this->enclosing_stm_ = pCVar4;
  this->local_symtab_ = pCVar1;
  this->enclosing_local_symtab_ = pCVar2;
  if (*err == 0) {
    pCVar11[1].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
    _vptr_CTcPrsNodeBase = (_func_int **)pCVar9;
    (local_58->super_CTPNStmTryBase).finally_stm_ = (CTPNStmFinally *)pCVar11;
  }
  else {
    local_58 = (CTPNStmTry *)0x0;
  }
  return (CTPNStm *)local_58;
}

Assistant:

CTPNStm *CTcParser::parse_try(int *err)
{
    CTPNStmTry *try_stm;
    CTPNStmEnclosing *old_enclosing;
    CTPNStm *body_stm;

    /* create the 'try' statement node */
    try_stm = new CTPNStmTry(enclosing_stm_);

    /* 
     *   the 'try' is the enclosing statement for the duration of its
     *   protected code block 
     */
    old_enclosing = set_enclosing_stm(try_stm);
    
    /* skip the 'try' */
    G_tok->next();

    /* parse the body of the 'try' block */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the previous enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if parsing the body failed, stop now */
    if (*err)
        return 0;

    /* add the body to the 'try' */
    try_stm->set_body_stm(body_stm);

    /* 
     *   check for 'catch' clauses - there could be several, so keep going
     *   until we stop seeing 'catch' keywords 
     */
    while (G_tok->cur() == TOKT_CATCH)
    {
        int catch_has_err;
        CTPNStm *catch_body;
        CTPNStmCatch *catch_stm;
        tcprs_scope_t scope_data;

        /* create a local scope for the 'catch' clause */
        enter_scope(&scope_data);
        create_scope_local_symtab();
        
        /* create the 'catch' statement node */
        catch_stm = new CTPNStmCatch();

        /* 
         *   set the 'catch' clause's source position independently of the
         *   overall 'try' statement, so that the debugger can track entry
         *   into this clause 
         */
        catch_stm->set_source_pos(G_tok->get_last_desc(),
                                  G_tok->get_last_linenum());

        /* presume we'll parse this successfully */
        catch_has_err = FALSE;
            
        /* skip the 'catch' keyword and check for the left paren */
        if (G_tok->next() == TOKT_LPAR)
        {
            /* skip the paren */
            G_tok->next();
        }
        else
        {
            /* log the error */
            G_tok->log_error_curtok(TCERR_REQ_CATCH_LPAR);
        }

        /* get the exception class token */
        if (G_tok->cur() == TOKT_SYM)
        {
            /* set the class name in the 'catch' clause */
            catch_stm->set_exc_class(G_tok->getcur());

            /* move on */
            G_tok->next();
        }
        else
        {
            /* flag the problem */
            G_tok->log_error_curtok(TCERR_REQ_CATCH_CLASS);

            /* unless this is a close paren, skip the errant token */
            if (G_tok->cur() != TOKT_RPAR)
                G_tok->next();

            /* note the error */
            catch_has_err = TRUE;
        }

        /* get the variable name token */
        if (G_tok->cur() == TOKT_SYM)
        {
            CTcSymLocal *var;
            
            /* 
             *   create the local variable - note that this variable is
             *   implicitly assigned when the 'catch' clause is entered, so
             *   mark it as initially assigned; we don't care if the
             *   variable is ever used, so also mark it as used 
             */
            var = local_symtab_->add_local(G_tok->getcur()->get_text(),
                                           G_tok->getcur()->get_text_len(),
                                           alloc_local(),
                                           FALSE, TRUE, TRUE);
            
            /* set the variable in the 'catch' clause */
            if (!catch_has_err)
                catch_stm->set_exc_var(var);

            /* move on */
            G_tok->next();
        }
        else
        {
            /* flag the problem */
            G_tok->log_error_curtok(TCERR_REQ_CATCH_VAR);

            /* unless this is a close paren, skip the errant token */
            if (G_tok->cur() != TOKT_RPAR)
                G_tok->next();

            /* note the error */
            catch_has_err = TRUE;
        }

        /* check for the close paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* skip the paren */
            G_tok->next();
        }
        else
        {
            /* 
             *   log the error and continue, assuming that the paren is
             *   simply missing and things are otherwise okay 
             */
            G_tok->log_error_curtok(TCERR_REQ_CATCH_RPAR);
        }

        /* 
         *   parse the 'catch' statement block - we've already established
         *   a special scope for the 'catch' block, so don't start a new
         *   scope if the block contains a compound statement 
         */
        catch_body = parse_stm(err, 0, TRUE);

        /* leave the special 'catch' scope */
        leave_scope(&scope_data);

        /* if the statement block failed, give up now */
        if (*err)
            return 0;

        /* add the 'catch' clause to the 'try' if we were successful */
        if (!catch_has_err)
        {
            /* set the 'catch' node's body */
            catch_stm->set_body(catch_body);

            /* set the local scope in the 'catch' */
            catch_stm->set_symtab(local_symtab_);
            
            /* add the 'catch' to the 'try' */
            try_stm->add_catch(catch_stm);
        }
    }

    /* check for a 'finally' clause */
    if (G_tok->cur() == TOKT_FINALLY)
    {
        CTPNStmFinally *fin_stm;
        CTPNStm *fin_body;
        tcprs_scope_t scope_data;
        CTPNStmEnclosing *old_enclosing;

        /* 
         *   the locals we allocate for the 'finally' are in the finally's
         *   own scope - the slots can be reused later 
         */
        enter_scope(&scope_data);

        /* create the 'finally' node */
        fin_stm = new CTPNStmFinally(enclosing_stm_,
                                     alloc_local(), alloc_local());

        /* 
         *   set the 'finally' clause's source position - we want this
         *   clause to have its own source position independent of the
         *   'try' statement of which it is a part, so that the debugger
         *   can keep track of entry into this clause's generated code 
         */
        fin_stm->set_source_pos(G_tok->get_last_desc(),
                                G_tok->get_last_linenum());

        /* skip the 'finally' keyword */
        G_tok->next();

        /* set the 'finally' to enclose its body */
        old_enclosing = set_enclosing_stm(fin_stm);

        /* parse the 'finally' statement block */
        fin_body = parse_stm(err, 0, FALSE);

        /* set the 'finally' block's closing position, if present */
        if (fin_body != 0)
        {
            fin_stm->set_end_pos(
                fin_body->get_end_desc(), fin_body->get_end_linenum());
        }

        /* restore the enclosing statement */
        set_enclosing_stm(old_enclosing);

        /* we're done with the special scope */
        leave_scope(&scope_data);

        /* if that failed, give up now */
        if (*err)
            return 0;

        /* set the 'finally' node's body */
        fin_stm->set_body(fin_body);

        /* add the 'finally' to the 'try' */
        try_stm->set_finally(fin_stm);
    }

    /* make sure we have at least one 'catch' or 'finally' clause */
    if (!try_stm->has_catch_or_finally())
        try_stm->log_error(TCERR_TRY_WITHOUT_CATCH);

    /* return the 'try' statement node */
    return try_stm;
}